

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

void nn_stcp_term(nn_stcp *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_STCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x58);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x3c8));
  nn_msg_term((nn_msg *)0x30bc3b);
  nn_msg_term((nn_msg *)0x30bc4b);
  nn_pipebase_term((nn_pipebase *)0x30bc5b);
  nn_streamhdr_term((nn_streamhdr *)0x30bc68);
  nn_fsm_term((nn_fsm *)0x30bc71);
  return;
}

Assistant:

void nn_stcp_term (struct nn_stcp *self)
{
    nn_assert_state (self, NN_STCP_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}